

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O0

void __thiscall
Transaction_CommitEmptyDoesNothing_Test::TestBody(Transaction_CommitEmptyDoesNothing_Test *this)

{
  bool bVar1;
  shared_ptr<pstore::file::in_memory> *file;
  header *phVar2;
  char *pcVar3;
  AssertHelper local_1f8;
  Message local_1f0;
  typed_address<pstore::trailer> local_1e8;
  value_type local_1e0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_1b8 [8];
  transaction<std::unique_lock<mock_mutex>_> transaction;
  mock_mutex mutex;
  Message local_170;
  typed_address<pstore::trailer> local_168;
  value_type local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar;
  header *header;
  database db;
  Transaction_CommitEmptyDoesNothing_Test *this_local;
  
  db.sync_name_.field_2._8_8_ = this;
  file = in_memory_store::file(&(this->super_Transaction).store_);
  pstore::database::database<pstore::file::in_memory>((database *)&header,file,true);
  pstore::database::set_vacuum_mode((database *)&header,disabled);
  phVar2 = anon_unknown.dwarf_2883f3::Transaction::get_header(&this->super_Transaction);
  local_168 = std::atomic<pstore::typed_address<pstore::trailer>_>::load
                        (&phVar2->footer_pos,memory_order_seq_cst);
  local_160 = pstore::typed_address<pstore::trailer>::absolute(&local_168);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_158,"pstore::leader_size","header->footer_pos.load ().absolute ()",
             &pstore::leader_size,&local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe88,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x6f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffe88,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe88);
    testing::Message::~Message(&local_170);
  }
  transaction.lock_._13_3_ = 0;
  transaction.lock_._12_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  if (transaction.lock_._12_4_ == 0) {
    std::unique_lock<mock_mutex>::unique_lock
              ((unique_lock<mock_mutex> *)&gtest_ar_1.message_,
               (mutex_type *)&transaction.lock_.field_0xb);
    ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_1b8,(database *)&header,
            (unique_lock<mock_mutex> *)&gtest_ar_1.message_);
    std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&gtest_ar_1.message_);
    pstore::transaction_base::commit((transaction_base *)local_1b8);
    pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
              ((transaction<std::unique_lock<mock_mutex>_> *)local_1b8);
    local_1e8 = std::atomic<pstore::typed_address<pstore::trailer>_>::load
                          (&phVar2->footer_pos,memory_order_seq_cst);
    local_1e0 = pstore::typed_address<pstore::trailer>::absolute(&local_1e8);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_1d8,"pstore::leader_size","header->footer_pos.load ().absolute ()",
               &pstore::leader_size,&local_1e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
    if (!bVar1) {
      testing::Message::Message(&local_1f0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                 ,0x77,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      testing::Message::~Message(&local_1f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
    transaction.lock_._12_4_ = 0;
  }
  pstore::database::~database((database *)&header);
  return;
}

Assistant:

TEST_F (Transaction, CommitEmptyDoesNothing) {
    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);

    // A quick check of the initial state.
    auto header = this->get_header ();
    ASSERT_EQ (pstore::leader_size, header->footer_pos.load ().absolute ());

    {
        mock_mutex mutex;
        auto transaction = begin (db, std::unique_lock<mock_mutex>{mutex});
        transaction.commit ();
    }

    EXPECT_EQ (pstore::leader_size, header->footer_pos.load ().absolute ());
}